

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall Js::JavascriptLibraryBase::Finalize(JavascriptLibraryBase *this,bool isShutdown)

{
  bool bVar1;
  ScriptContext **ppSVar2;
  ScriptContext *pSVar3;
  ThreadContext *this_00;
  bool isShutdown_local;
  JavascriptLibraryBase *this_local;
  
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&this->scriptContext);
  if (*ppSVar2 != (ScriptContext *)0x0) {
    pSVar3 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->scriptContext);
    ScriptContext::ResetWeakReferenceDictionaryList(pSVar3);
    pSVar3 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->scriptContext);
    ScriptContext::SetIsFinalized(pSVar3);
    pSVar3 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->scriptContext);
    ScriptContext::MarkForClose(pSVar3);
    pSVar3 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->scriptContext);
    bVar1 = ScriptContext::IsRegistered(pSVar3);
    if (bVar1) {
      pSVar3 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->scriptContext);
      this_00 = ScriptContext::GetThreadContext(pSVar3);
      ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                          ((WriteBarrierPtr *)&this->scriptContext);
      ThreadContext::UnregisterScriptContext(this_00,*ppSVar2);
    }
  }
  return;
}

Assistant:

void JavascriptLibraryBase::Finalize(bool isShutdown)
    {
        if (scriptContext)
        {
            // Clear the weak reference dictionary so we don't need to clean them
            // during PostCollectCallBack before Dispose deleting the script context.
            scriptContext->ResetWeakReferenceDictionaryList();
            scriptContext->SetIsFinalized();
            scriptContext->MarkForClose();
            if (scriptContext->IsRegistered())
            {
                scriptContext->GetThreadContext()->UnregisterScriptContext(scriptContext);
            }
        }
    }